

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void DumpString(TString *s,DumpState *D)

{
  size_t size_00;
  TString *b;
  size_t size;
  
  if (s == (TString *)0x0) {
    b = (TString *)&size;
    size = 0;
    size_00 = 8;
  }
  else {
    size = (s->tsv).len + 1;
    DumpBlock(&size,8,D);
    b = s + 1;
    size_00 = size;
  }
  DumpBlock(b,size_00,D);
  return;
}

Assistant:

static void DumpString(const TString* s, DumpState* D)
{
 if (s==NULL)
 {
  size_t size=0;
  DumpVar(size,D);
 }
 else
 {
  size_t size=s->tsv.len+1;		/* include trailing '\0' */
  DumpVar(size,D);
  DumpBlock(getstr(s),size*sizeof(char),D);
 }
}